

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O3

void __thiscall Excel::Book::onSheet(Book *this,size_t idx,wstring *name)

{
  pointer pwVar1;
  __uniq_ptr_impl<Excel::Sheet,_std::default_delete<Excel::Sheet>_> __ptr;
  _Head_base<0UL,_Excel::Sheet_*,_false> _Var2;
  pointer puVar3;
  _Tuple_impl<0UL,_Excel::Sheet_*,_std::default_delete<Excel::Sheet>_> local_30;
  
  _Var2._M_head_impl = (Sheet *)operator_new(0xb0);
  *(undefined8 *)
   &((_Var2._M_head_impl)->m_cells).
    super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
       = 0;
  *(pointer *)
   ((long)&((_Var2._M_head_impl)->m_cells).
           super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((_Var2._M_head_impl)->m_cells).
           super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
   + 0x10) = (pointer)0x0;
  ((_Var2._M_head_impl)->m_dummyCell).m_stringData._M_dataplus =
       (pointer)((long)&((_Var2._M_head_impl)->m_dummyCell).m_stringData + 0x10);
  *(size_type *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_stringData + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
    *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_stringData + 0x10))->_M_local_buf[0] = L'\0';
  ((_Var2._M_head_impl)->m_dummyCell).m_doubleData = 0.0;
  ((_Var2._M_head_impl)->m_dummyCell).m_formula.m_valueType = UnknownValue;
  *(double *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_formula + 8) = 0.0;
  *(ErrorValues *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_formula + 0x10) = UnknownError;
  *(bool *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_formula + 0x14) = false;
  (((wstring *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_formula + 0x18))->_M_dataplus)._M_p =
       ((pointer)((long)&((_Var2._M_head_impl)->m_dummyCell).m_formula + 0x28))._M_p;
  *(size_type *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_formula + 0x20) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
    *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_formula + 0x28))->_M_local_buf[0] = L'\0';
  *(undefined4 *)((long)&((_Var2._M_head_impl)->m_dummyCell).m_formula + 0x38) = 0;
  ((_Var2._M_head_impl)->m_dummyCell).m_isNull = true;
  ((_Var2._M_head_impl)->m_dummyCell).m_type = Unknown;
  (_Var2._M_head_impl)->m_columnsCount = 0;
  ((_Var2._M_head_impl)->m_name)._M_dataplus._M_p = (pointer)&((_Var2._M_head_impl)->m_name).field_2
  ;
  pwVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&(_Var2._M_head_impl)->m_name,pwVar1,pwVar1 + name->_M_string_length);
  puVar3 = (this->m_sheets).
           super__Vector_base<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_sheets).
                    super__Vector_base<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <= idx) {
    local_30.super__Head_base<0UL,_Excel::Sheet_*,_false>._M_head_impl =
         (_Head_base<0UL,_Excel::Sheet_*,_false>)
         (_Head_base<0UL,_Excel::Sheet_*,_false>)_Var2._M_head_impl;
    std::
    vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
    ::resize(&this->m_sheets,idx + 1);
    puVar3 = (this->m_sheets).
             super__Vector_base<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var2 = local_30.super__Head_base<0UL,_Excel::Sheet_*,_false>._M_head_impl;
  }
  local_30.super__Head_base<0UL,_Excel::Sheet_*,_false>._M_head_impl =
       (_Head_base<0UL,_Excel::Sheet_*,_false>)(Sheet *)0x0;
  __ptr._M_t.super__Tuple_impl<0UL,_Excel::Sheet_*,_std::default_delete<Excel::Sheet>_>.
  super__Head_base<0UL,_Excel::Sheet_*,_false>._M_head_impl =
       puVar3[idx]._M_t.super___uniq_ptr_impl<Excel::Sheet,_std::default_delete<Excel::Sheet>_>._M_t
  ;
  puVar3[idx]._M_t.super___uniq_ptr_impl<Excel::Sheet,_std::default_delete<Excel::Sheet>_>._M_t =
       (tuple<Excel::Sheet_*,_std::default_delete<Excel::Sheet>_>)_Var2._M_head_impl;
  if ((_Tuple_impl<0UL,_Excel::Sheet_*,_std::default_delete<Excel::Sheet>_>)
      __ptr._M_t.super__Tuple_impl<0UL,_Excel::Sheet_*,_std::default_delete<Excel::Sheet>_>.
      super__Head_base<0UL,_Excel::Sheet_*,_false>._M_head_impl != (Sheet *)0x0) {
    std::default_delete<Excel::Sheet>::operator()
              ((default_delete<Excel::Sheet> *)(puVar3 + idx),
               (Sheet *)__ptr._M_t.
                        super__Tuple_impl<0UL,_Excel::Sheet_*,_std::default_delete<Excel::Sheet>_>.
                        super__Head_base<0UL,_Excel::Sheet_*,_false>._M_head_impl);
  }
  if (local_30.super__Head_base<0UL,_Excel::Sheet_*,_false>._M_head_impl != (Sheet *)0x0) {
    std::default_delete<Excel::Sheet>::operator()
              ((default_delete<Excel::Sheet> *)&local_30,
               (Sheet *)local_30.super__Head_base<0UL,_Excel::Sheet_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

inline void
Book::onSheet( size_t idx, const std::wstring & name )
{
	auto sheet = std::make_unique< Sheet > ( name );
	if( m_sheets.size() <= idx )
		m_sheets.resize( idx + 1 );
	m_sheets[ idx ] = std::move( sheet );
}